

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaAnnotPtr xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int needed)

{
  _xmlAttr *p_Var1;
  bool bVar2;
  int iVar3;
  xmlSchemaAnnotPtr content;
  xmlAttrPtr attr;
  xmlSchemaTypePtr attr_00;
  xmlSchemaTypePtr in_RCX;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr pxVar4;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  long lVar5;
  long lVar6;
  char *str2;
  xmlChar *str1;
  xmlChar **in_R8;
  char *in_R9;
  xmlSchemaTypePtr ownerElem;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaAnnotPtr)0x0;
  }
  if (needed != 0) {
    content = (xmlSchemaAnnotPtr)(*xmlMalloc)(0x10);
    if (content != (xmlSchemaAnnotPtr)0x0) {
      content->next = (_xmlSchemaAnnot *)0x0;
      content->content = (xmlNodePtr)0x0;
      content->content = node;
      goto LAB_001952b4;
    }
    xmlSchemaPErrMemory(ctxt);
  }
  content = (xmlSchemaAnnotPtr)0x0;
LAB_001952b4:
  for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
    if (((p_Var1->ns == (xmlNs *)0x0) &&
        (iVar3 = xmlStrEqual(p_Var1->name,"id"), pxVar4 = extraout_RDX, iVar3 == 0)) ||
       ((p_Var1->ns != (xmlNs *)0x0 &&
        (iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
        pxVar4 = extraout_RDX_00, iVar3 != 0)))) {
      xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar4,(xmlAttrPtr)in_RCX);
    }
  }
  attr = xmlSchemaGetPropNode(node,"id");
  if (attr != (xmlAttrPtr)0x0) {
    xmlSchemaPValAttrNodeID(ctxt,attr);
  }
  ownerElem = (xmlSchemaTypePtr)node->children;
  if (ownerElem != (xmlSchemaTypePtr)0x0) {
    bVar2 = false;
    do {
      if (((ownerElem->node == (xmlNodePtr)0x0) ||
          (iVar3 = xmlStrEqual(ownerElem->name,(xmlChar *)"appinfo"), iVar3 == 0)) ||
         (iVar3 = xmlStrEqual(ownerElem->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar3 == 0)) {
        if (((ownerElem->node == (xmlNodePtr)0x0) ||
            (iVar3 = xmlStrEqual(ownerElem->name,(xmlChar *)"documentation"), iVar3 == 0)) ||
           (iVar3 = xmlStrEqual(ownerElem->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
           , iVar3 == 0)) {
          if (!bVar2) {
            in_R8 = (xmlChar **)0x0;
            in_R9 = "(appinfo | documentation)*";
            in_RCX = ownerElem;
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                       (xmlNodePtr)ownerElem,(xmlNodePtr)0x0,"(appinfo | documentation)*",
                       (char *)content);
          }
          bVar2 = true;
        }
        else {
          lVar6._0_4_ = ownerElem->flags;
          lVar6._4_4_ = ownerElem->contentType;
          for (; lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x30)) {
            if (*(long *)(lVar6 + 0x48) == 0) {
              str1 = *(xmlChar **)(lVar6 + 0x10);
              str2 = "source";
LAB_00195469:
              iVar3 = xmlStrEqual(str1,(xmlChar *)str2);
              pxVar4 = extraout_RDX_04;
              if (iVar3 == 0) {
LAB_00195472:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)lVar6,pxVar4,(xmlAttrPtr)in_RCX);
              }
            }
            else {
              iVar3 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar6 + 0x48) + 0x10),
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar4 = extraout_RDX_03;
              if (iVar3 != 0) goto LAB_00195472;
              iVar3 = xmlStrEqual(*(xmlChar **)(lVar6 + 0x10),"lang");
              if (iVar3 != 0) {
                str1 = *(xmlChar **)(*(long *)(lVar6 + 0x48) + 0x10);
                str2 = "http://www.w3.org/XML/1998/namespace";
                goto LAB_00195469;
              }
            }
          }
          for (pxVar4 = *(xmlSchemaBasicItemPtr *)&ownerElem->flags;
              pxVar4 != (xmlSchemaBasicItemPtr)0x0; pxVar4 = *(xmlSchemaBasicItemPtr *)(pxVar4 + 3))
          {
            if (((pxVar4[4].dummy != (void *)0x0) &&
                (iVar3 = xmlStrEqual(*(xmlChar **)(pxVar4 + 1),"lang"), iVar3 != 0)) &&
               (iVar3 = xmlStrEqual(*(xmlChar **)((long)pxVar4[4].dummy + 0x10),
                                    (xmlChar *)"http://www.w3.org/XML/1998/namespace"), iVar3 != 0))
            goto LAB_0019551b;
          }
          pxVar4 = (xmlSchemaBasicItemPtr)0x0;
LAB_0019551b:
          if (pxVar4 != (xmlSchemaBasicItemPtr)0x0) {
            attr_00 = xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE);
            in_RCX = (xmlSchemaTypePtr)0x0;
            xmlSchemaPValAttrNode(ctxt,pxVar4,(xmlAttrPtr)attr_00,(xmlSchemaTypePtr)0x0,in_R8);
          }
        }
      }
      else {
        lVar5._0_4_ = ownerElem->flags;
        lVar5._4_4_ = ownerElem->contentType;
        for (; lVar5 != 0; lVar5 = *(long *)(lVar5 + 0x30)) {
          if (((*(long *)(lVar5 + 0x48) == 0) &&
              (iVar3 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"source"), pxVar4 = extraout_RDX_01,
              iVar3 == 0)) ||
             ((*(long *)(lVar5 + 0x48) != 0 &&
              (iVar3 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar5 + 0x48) + 0x10),
                                   (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              pxVar4 = extraout_RDX_02, iVar3 != 0)))) {
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)lVar5,pxVar4,(xmlAttrPtr)in_RCX);
          }
        }
        in_RCX = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
        in_R8 = (xmlChar **)0x0;
        xmlSchemaPValAttr(ctxt,(xmlSchemaBasicItemPtr)ownerElem,(xmlNodePtr)0x1e2210,(char *)in_RCX,
                          (xmlSchemaTypePtr)0x0,(xmlChar **)in_R9);
      }
      ownerElem = (xmlSchemaTypePtr)ownerElem->annot;
    } while (ownerElem != (xmlSchemaTypePtr)0x0);
  }
  return content;
}

Assistant:

static xmlSchemaAnnotPtr
xmlSchemaParseAnnotation(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node, int needed)
{
    xmlSchemaAnnotPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int barked = 0;

    /*
    * INFO: S4S completed.
    */
    /*
    * id = ID
    * {any attributes with non-schema namespace . . .}>
    * Content: (appinfo | documentation)*
    */
    if ((ctxt == NULL) || (node == NULL))
        return (NULL);
    if (needed)
	ret = xmlSchemaNewAnnot(ctxt, node);
    else
	ret = NULL;
    attr = node->properties;
    while (attr != NULL) {
	if (((attr->ns == NULL) &&
	    (!xmlStrEqual(attr->name, BAD_CAST "id"))) ||
	    ((attr->ns != NULL) &&
	    xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    while (child != NULL) {
	if (IS_SCHEMA(child, "appinfo")) {
	    /* TODO: make available the content of "appinfo". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (((attr->ns == NULL) &&
		     (!xmlStrEqual(attr->name, BAD_CAST "source"))) ||
		     ((attr->ns != NULL) &&
		      xmlStrEqual(attr->ns->href, xmlSchemaNs))) {

		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
		attr = attr->next;
	    }
	    xmlSchemaPValAttr(ctxt, NULL, child, "source",
		xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI), NULL);
	    child = child->next;
	} else if (IS_SCHEMA(child, "documentation")) {
	    /* TODO: make available the content of "documentation". */
	    /*
	    * source = anyURI
	    * {any attributes with non-schema namespace . . .}>
	    * Content: ({any})*
	    */
	    attr = child->properties;
	    while (attr != NULL) {
		if (attr->ns == NULL) {
		    if (!xmlStrEqual(attr->name, BAD_CAST "source")) {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		} else {
		    if (xmlStrEqual(attr->ns->href, xmlSchemaNs) ||
			(xmlStrEqual(attr->name, BAD_CAST "lang") &&
			(!xmlStrEqual(attr->ns->href, XML_XML_NAMESPACE)))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
		attr = attr->next;
	    }
	    /*
	    * Attribute "xml:lang".
	    */
	    attr = xmlSchemaGetPropNodeNs(child, (const char *) XML_XML_NAMESPACE, "lang");
	    if (attr != NULL)
		xmlSchemaPValAttrNode(ctxt, NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_LANGUAGE), NULL);
	    child = child->next;
	} else {
	    if (!barked)
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		    NULL, node, child, NULL, "(appinfo | documentation)*");
	    barked = 1;
	    child = child->next;
	}
    }

    return (ret);
}